

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::dotSI16x8toI32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  long lVar4;
  Literal *val;
  Type *this_00;
  long lVar5;
  undefined1 local_248 [8];
  LaneArray<4UL_*_2UL> lhs;
  LaneArray<4UL_*_2UL> rhs;
  LaneArray<4UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  undefined8 local_48;
  Literal *local_40;
  Type *local_38;
  
  local_40 = (Literal *)local_248;
  getLanes<short,8>((LaneArray<8> *)local_40,(wasm *)this,other);
  local_38 = &lhs._M_elems[7].type;
  getLanes<short,8>((LaneArray<8> *)local_38,(wasm *)other,val);
  rhs._M_elems[7].type.id = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_58.i32 = 0;
    local_48 = 2;
    this_00 = &result._M_elems[lVar4 + -1].type;
    if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_58) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,(Literal *)&local_58.func);
    }
    ~Literal((Literal *)&local_58.func);
    for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 0x18) {
      iVar1 = geti32((Literal *)this_00);
      iVar2 = geti32((Literal *)((long)&local_40->field_0 + lVar5));
      iVar3 = geti32((Literal *)((long)&local_38->id + lVar5));
      local_58.i32 = iVar3 * iVar2 + iVar1;
      local_48 = 2;
      if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_58) {
        ~Literal((Literal *)this_00);
        Literal((Literal *)this_00,(Literal *)&local_58.func);
      }
      ~Literal((Literal *)&local_58.func);
    }
    local_40 = local_40 + 2;
    local_38 = local_38 + 6;
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_248);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::dotSI16x8toI32x4(const Literal& other) const {
  return dot<4, 2, &Literal::getLanesSI16x8>(*this, other);
}